

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

string * Color::strip(string *__return_storage_ptr__,string *input)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 local_24;
  int i;
  bool inside;
  int length;
  string *input_local;
  string *output;
  
  iVar2 = std::__cxx11::string::length();
  bVar1 = false;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
    if (bVar1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
      if (*pcVar3 == 'm') {
        bVar1 = false;
      }
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
      if (*pcVar3 == '\x1b') {
        bVar1 = true;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Color::strip (const std::string& input)
{
#ifdef FEATURE_COLOR
  int length = input.length ();
  bool inside = false;
  std::string output;
  for (int i = 0; i < length; ++i)
  {
    if (inside)
    {
      if (input[i] == 'm')
        inside = false;
    }
    else
    {
      if (input[i] == 033)
        inside = true;
      else
        output += input[i];
    }
  }

  return output;
#else
  return input;
#endif
}